

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLParser.hpp
# Opt level: O0

void __thiscall xe::xml::Tokenizer::appendTokenStr(Tokenizer *this,string *dst)

{
  uchar uVar1;
  uchar *puVar2;
  int local_24;
  int ndx;
  size_t oldLen;
  string *dst_local;
  Tokenizer *this_local;
  
  std::__cxx11::string::size();
  std::__cxx11::string::resize((ulong)dst);
  for (local_24 = 0; local_24 < this->m_curTokenLen; local_24 = local_24 + 1) {
    uVar1 = de::RingBuffer<unsigned_char>::peekBack(&this->m_buf,local_24);
    puVar2 = (uchar *)std::__cxx11::string::operator[]((ulong)dst);
    *puVar2 = uVar1;
  }
  return;
}

Assistant:

inline void Tokenizer::appendTokenStr (std::string& dst) const
{
	DE_ASSERT(m_curToken != TOKEN_INCOMPLETE && m_curToken != TOKEN_END_OF_STRING);

	size_t oldLen = dst.size();
	dst.resize(oldLen+m_curTokenLen);

	for (int ndx = 0; ndx < m_curTokenLen; ndx++)
		dst[oldLen+ndx] = m_buf.peekBack(ndx);
}